

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

int16_list * get_int16_list(BinarySource *in)

{
  uintmax_t n_00;
  int16_list *piVar1;
  uintmax_t uVar2;
  ulong local_28;
  size_t i;
  int16_list *list;
  size_t n;
  BinarySource *in_local;
  
  n_00 = get_uint(in);
  piVar1 = make_int16_list(n_00);
  for (local_28 = 0; local_28 < n_00; local_28 = local_28 + 1) {
    uVar2 = get_uint(in);
    piVar1->integers[local_28] = (uint16_t)uVar2;
  }
  return piVar1;
}

Assistant:

static int16_list *get_int16_list(BinarySource *in)
{
    size_t n = get_uint(in);
    int16_list *list = make_int16_list(n);
    for (size_t i = 0; i < n; i++)
        list->integers[i] = get_uint(in);
    return list;
}